

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeHalt(Vdbe *p)

{
  uint tripCode;
  int iVar1;
  long *in_RDI;
  int isSpecialError;
  int eStatementOp;
  int mrc;
  sqlite3 *db;
  int rc;
  Vdbe *in_stack_00000058;
  sqlite3 *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined3 uVar2;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint deferred;
  int iVar3;
  sqlite3 *db_00;
  int local_14;
  int local_4;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (db_00->mallocFailed != '\0') {
    *(undefined4 *)((long)in_RDI + 0x34) = 7;
  }
  closeAllCursors((Vdbe *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((*(ushort *)(in_RDI + 0x19) >> 7 & 1) != 0) {
    iVar3 = 0;
    sqlite3VdbeEnter((Vdbe *)db_00);
    if (*(int *)((long)in_RDI + 0x34) == 0) {
      deferred = 0;
      tripCode = 0;
    }
    else {
      tripCode = *(uint *)((long)in_RDI + 0x34) & 0xff;
      uVar2 = (undefined3)in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd0 = CONCAT13(1,uVar2);
      if (((tripCode != 7) && (in_stack_ffffffffffffffd0 = CONCAT13(1,uVar2), tripCode != 10)) &&
         (in_stack_ffffffffffffffd0 = CONCAT13(1,uVar2), tripCode != 9)) {
        in_stack_ffffffffffffffd0 = CONCAT13(tripCode == 0xd,uVar2);
      }
      deferred = in_stack_ffffffffffffffd0 >> 0x18;
    }
    if ((deferred != 0) && (((*(ushort *)(in_RDI + 0x19) >> 6 & 1) == 0 || (tripCode != 9)))) {
      if (((tripCode == 7) || (tripCode == 0xd)) && ((*(ushort *)(in_RDI + 0x19) >> 5 & 1) != 0)) {
        iVar3 = 2;
      }
      else {
        sqlite3RollbackAll(db_00,tripCode);
        sqlite3CloseSavepoints((sqlite3 *)CONCAT44(deferred,in_stack_ffffffffffffffd0));
        db_00->autoCommit = '\x01';
        in_RDI[7] = 0;
      }
    }
    if ((*(int *)((long)in_RDI + 0x34) == 0) ||
       ((*(char *)((long)in_RDI + 0xc4) == '\x03' && (deferred == 0)))) {
      sqlite3VdbeCheckFk((Vdbe *)CONCAT44(tripCode,iVar3),deferred);
    }
    if ((((db_00->nVTrans < 1) || (db_00->aVTrans != (VTable **)0x0)) && (db_00->autoCommit != '\0')
        ) && (db_00->nVdbeWrite == (uint)((*(ushort *)(in_RDI + 0x19) >> 6 & 1) == 0))) {
      if ((*(int *)((long)in_RDI + 0x34) == 0) ||
         ((*(char *)((long)in_RDI + 0xc4) == '\x03' && (deferred == 0)))) {
        iVar1 = sqlite3VdbeCheckFk((Vdbe *)CONCAT44(tripCode,iVar3),deferred);
        if (iVar1 == 0) {
          if ((db_00->flags & 0x200000000) == 0) {
            local_14 = vdbeCommit(in_stack_00000060,in_stack_00000058);
          }
          else {
            local_14 = 0xb;
            db_00->flags = db_00->flags & 0xfffffffdffffffff;
          }
        }
        else {
          if ((*(ushort *)(in_RDI + 0x19) >> 6 & 1) != 0) {
            sqlite3VdbeLeave((Vdbe *)0x16ffe7);
            return 1;
          }
          local_14 = 0x313;
        }
        if ((local_14 == 5) && ((*(ushort *)(in_RDI + 0x19) >> 6 & 1) != 0)) {
          sqlite3VdbeLeave((Vdbe *)0x17007a);
          return 5;
        }
        if (local_14 == 0) {
          db_00->nDeferredCons = 0;
          db_00->nDeferredImmCons = 0;
          db_00->flags = db_00->flags & 0xfffffffffff7ffff;
          sqlite3CommitInternalChanges(db_00);
        }
        else {
          sqlite3SystemError((sqlite3 *)CONCAT44(deferred,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
          *(int *)((long)in_RDI + 0x34) = local_14;
          sqlite3RollbackAll(db_00,tripCode);
          in_RDI[7] = 0;
        }
      }
      else if ((*(int *)((long)in_RDI + 0x34) == 0x11) && (1 < db_00->nVdbeActive)) {
        in_RDI[7] = 0;
      }
      else {
        sqlite3RollbackAll(db_00,tripCode);
        in_RDI[7] = 0;
      }
      db_00->nStatement = 0;
    }
    else if (iVar3 == 0) {
      if ((*(int *)((long)in_RDI + 0x34) == 0) || (*(char *)((long)in_RDI + 0xc4) == '\x03')) {
        iVar3 = 1;
      }
      else if (*(char *)((long)in_RDI + 0xc4) == '\x02') {
        iVar3 = 2;
      }
      else {
        sqlite3RollbackAll(db_00,tripCode);
        sqlite3CloseSavepoints((sqlite3 *)CONCAT44(deferred,in_stack_ffffffffffffffd0));
        db_00->autoCommit = '\x01';
        in_RDI[7] = 0;
      }
    }
    if ((iVar3 != 0) &&
       (iVar1 = sqlite3VdbeCloseStatement
                          ((Vdbe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0),
       iVar1 != 0)) {
      if ((*(int *)((long)in_RDI + 0x34) == 0) || ((*(uint *)((long)in_RDI + 0x34) & 0xff) == 0x13))
      {
        *(int *)((long)in_RDI + 0x34) = iVar1;
        sqlite3DbFree((sqlite3 *)CONCAT44(deferred,in_stack_ffffffffffffffd0),
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        in_RDI[0x15] = 0;
      }
      sqlite3RollbackAll(db_00,tripCode);
      sqlite3CloseSavepoints((sqlite3 *)CONCAT44(deferred,in_stack_ffffffffffffffd0));
      db_00->autoCommit = '\x01';
      in_RDI[7] = 0;
    }
    if ((*(ushort *)(in_RDI + 0x19) >> 4 & 1) != 0) {
      if (iVar3 == 2) {
        sqlite3VdbeSetChanges(db_00,0);
      }
      else {
        sqlite3VdbeSetChanges(db_00,in_RDI[7]);
      }
      in_RDI[7] = 0;
    }
    sqlite3VdbeLeave((Vdbe *)0x1702d7);
  }
  db_00->nVdbeActive = db_00->nVdbeActive - 1;
  if ((*(ushort *)(in_RDI + 0x19) >> 6 & 1) == 0) {
    db_00->nVdbeWrite = db_00->nVdbeWrite + -1;
  }
  if ((*(ushort *)(in_RDI + 0x19) >> 7 & 1) != 0) {
    db_00->nVdbeRead = db_00->nVdbeRead - 1;
  }
  *(undefined1 *)((long)in_RDI + 199) = 3;
  if (db_00->mallocFailed != '\0') {
    *(undefined4 *)((long)in_RDI + 0x34) = 7;
  }
  local_4 = 0;
  if (*(int *)((long)in_RDI + 0x34) == 5) {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine.
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  assert( p->eVdbeState==VDBE_RUN_STATE );
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    if( p->rc ){
      mrc = p->rc & 0xff;
      isSpecialError = mrc==SQLITE_NOMEM
                    || mrc==SQLITE_IOERR
                    || mrc==SQLITE_INTERRUPT
                    || mrc==SQLITE_FULL;
    }else{
      mrc = isSpecialError = 0;
    }
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT,
      ** no rollback is necessary. Otherwise, at least a savepoint
      ** transaction must be rolled back to restore the database to a
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
      (void)sqlite3VdbeCheckFk(p, 0);
    }

    /* If the auto-commit flag is set and this is the only active writer
    ** VM, then we do either a commit or rollback of the current transaction.
    **
    ** Note: This block also runs if one of the special errors handled
    ** above has occurred.
    */
    if( !sqlite3VtabInSync(db)
     && db->autoCommit
     && db->nVdbeWrite==(p->readOnly==0)
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else if( db->flags & SQLITE_CorruptRdOnly ){
          rc = SQLITE_CORRUPT;
          db->flags &= ~SQLITE_CorruptRdOnly;
        }else{
          /* The auto-commit flag is true, the vdbe program was successful
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          sqlite3SystemError(db, rc);
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~(u64)SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else if( p->rc==SQLITE_SCHEMA && db->nVdbeActive>1 ){
        p->nChange = 0;
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter.
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  db->nVdbeActive--;
  if( !p->readOnly ) db->nVdbeWrite--;
  if( p->bIsReader ) db->nVdbeRead--;
  assert( db->nVdbeActive>=db->nVdbeRead );
  assert( db->nVdbeRead>=db->nVdbeWrite );
  assert( db->nVdbeWrite>=0 );
  p->eVdbeState = VDBE_HALT_STATE;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked()
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}